

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void produceSpriteData(Image *img,bool size8x16,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong x;
  long lVar4;
  ulong y;
  bool bVar5;
  uchar c;
  undefined4 local_5c;
  ulong local_58;
  Image *local_50;
  ulong local_48;
  array<unsigned_char,_16UL> data;
  
  local_5c = (undefined4)CONCAT71(in_register_00000031,size8x16);
  uVar1 = img->_height;
  uVar3 = (ulong)((int)img->_width / 8);
  puVar2 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_48 = (ulong)((int)uVar1 / 8);
  local_58 = uVar3 - 1;
  y = 0;
  x = 0;
  local_50 = img;
  while ((x < uVar3 && (y < local_48))) {
    imgtogb::convert(x,y,local_50,&data);
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      c = data._M_elems[lVar4];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(out,&c);
    }
    if ((char)local_5c == '\0') {
      x = x + 1;
      bVar5 = x == uVar3;
      if (bVar5) {
        x = 0;
      }
      y = y + bVar5;
    }
    else {
      if ((y & 1) != 0) {
        if (x == local_58) {
          x = 0;
        }
        else {
          y = y - 2;
          x = x + 1;
        }
      }
      y = y + 1;
    }
  }
  return;
}

Assistant:

void produceSpriteData(
	const Image &img,
	bool size8x16,
	std::vector<unsigned char> &out
) {
	std::array<unsigned char, 16> data;
	size_t ix, iy;

	size_t tiles_x = img.width() / 8;
	size_t tiles_y = img.height() / 8;

	out.clear();

	ix = iy = 0;
	while(ix < tiles_x && iy < tiles_y) {
		convert(ix, iy, img, data);
		for(unsigned char c : data) {
			out.push_back(c);
		}

		if(size8x16) {
			if(iy % 2 == 1) {
				if(ix == tiles_x-1) {
					ix = 0;
				} else {
					iy -= 2;
					ix++;
				}
			}
			iy++;
		} else {
			ix++;
			if(ix == tiles_x) {
				ix = 0;
				iy++;
			}
		}
	}
}